

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

void setupSourceManager(SourceManager *sourceManager)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  string_view pattern;
  StringRef macroName_00;
  string_view pattern_00;
  StringRef macroName_01;
  string_view pattern_01;
  error_code eVar1;
  ExprLhs<bool> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  AssertionHandler catchAssertionHandler;
  string testDir;
  
  findTestDir_abi_cxx11_();
  local_98._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_98._M_string_length = 0x1f;
  capturedExpression.m_size = 0x2a;
  capturedExpression.m_start = "!sourceManager.addUserDirectories(testDir)";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_98,capturedExpression,
             ContinueOnFailure);
  pattern._M_str = testDir._M_dataplus._M_p;
  pattern._M_len = testDir._M_string_length;
  eVar1 = slang::SourceManager::addUserDirectories(sourceManager,pattern);
  local_98._M_dataplus._M_p._0_1_ = eVar1._M_value == 0;
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_98._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_98._M_string_length = 0x20;
  capturedExpression_00.m_size = 0x2c;
  capturedExpression_00.m_start = "!sourceManager.addSystemDirectories(testDir)";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_98,capturedExpression_00,
             ContinueOnFailure);
  pattern_00._M_str = testDir._M_dataplus._M_p;
  pattern_00._M_len = testDir._M_string_length;
  eVar1 = slang::SourceManager::addSystemDirectories(sourceManager,pattern_00);
  local_98._M_dataplus._M_p._0_1_ = eVar1._M_value == 0;
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_98._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
  ;
  local_98._M_string_length = 0x21;
  capturedExpression_01.m_size = 0x38;
  capturedExpression_01.m_start = "!sourceManager.addSystemDirectories(testDir + \"system/\")";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_98,capturedExpression_01,
             ContinueOnFailure);
  std::operator+(&local_98,&testDir,"system/");
  pattern_01._M_str = local_98._M_dataplus._M_p;
  pattern_01._M_len = local_98._M_string_length;
  eVar1 = slang::SourceManager::addSystemDirectories(sourceManager,pattern_01);
  local_99.m_lhs = eVar1._M_value == 0;
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,&local_99);
  std::__cxx11::string::~string((string *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&testDir);
  return;
}

Assistant:

void setupSourceManager(SourceManager& sourceManager) {
    auto testDir = findTestDir();
    CHECK(!sourceManager.addUserDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir + "system/"));
}